

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O2

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile(SOLReader2<mp::SOLHandler_Easy> *this,string *name)

{
  char **__endptr;
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  uiolen *puVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  NLW2_SOLReadResultCode NVar8;
  int iVar9;
  FILE *pFVar10;
  size_t sVar11;
  char *pcVar12;
  size_type sVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  NLHeader *pNVar18;
  size_t sVar19;
  size_t sVar20;
  char *pcVar21;
  ulong __size;
  long lVar22;
  uiolen *puVar23;
  double dVar24;
  allocator<char> local_89;
  FILE *local_88;
  uiolen *local_80;
  AMPLOptions ao;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  File local_38;
  
  pcVar21 = (name->_M_dataplus)._M_p;
  this->stub_ = pcVar21;
  pFVar10 = fopen(pcVar21,"rb");
  this->internal_rv_ = 0x3e5;
  local_38.f_ = (FILE *)pFVar10;
  if (pFVar10 == (FILE *)0x0) {
    serror(this,"can\'t open \'%s\'",this->stub_);
    this->internal_rv_ = 0x3e6;
    NVar8 = NLW2_SOLRead_Fail_Open;
    goto LAB_00114798;
  }
  local_80 = &this->L;
  sVar11 = fread(local_80,4,1,pFVar10);
  local_88 = pFVar10;
  if ((sVar11 != 0) && (this->L == 6)) {
    this->binary = 1;
    sVar11 = fread(this->buf,6,1,pFVar10);
    if ((sVar11 != 0) &&
       (((iVar7 = bcmp(this->buf,"binary",6), iVar7 == 0 &&
         (sVar11 = fread(local_80,4,1,local_88), sVar11 != 0)) && (*local_80 == 6))))
    goto LAB_00113ab0;
    goto LAB_00113a6a;
  }
  this->binary = 0;
  rewind(pFVar10);
LAB_00113ab0:
  this->need_vbtol = 0;
  this->have_options = 0;
  this->bs = 1;
  this->nbs = 0;
  if (this->binary == 0) {
    pcVar21 = this->buf;
    __endptr = &this->se;
    pFVar10 = local_88;
LAB_00113df6:
    pcVar12 = fgets(pcVar21,0x200,pFVar10);
    pFVar10 = local_88;
    pcVar14 = pcVar21;
    if (pcVar12 != (char *)0x0) {
LAB_00113e17:
      *__endptr = pcVar14;
      if (*pcVar14 != '\r') {
        if (*pcVar14 == '\0') goto LAB_00113e47;
LAB_00113e2f:
        pcVar14 = pcVar14 + 1;
        goto LAB_00113e17;
      }
      if (pcVar14[1] != '\n') goto LAB_00113e2f;
      *pcVar14 = '\n';
      pcVar14 = *__endptr;
      *__endptr = pcVar14 + 1;
      pcVar14[1] = '\0';
LAB_00113e47:
      if (*pcVar21 == '\n') goto LAB_00113f0b;
      pcVar14 = this->se;
      sVar20 = (long)pcVar14 - (long)pcVar21;
      this->n1 = sVar20;
      this->b1 = pcVar21;
      pcVar12 = pcVar21;
      if ((*pcVar21 == '\b') && (this->bs != 0)) {
        this->n = sVar20;
        lVar22 = -0x189;
        pcVar12 = (char *)0x0;
        do {
          pcVar17 = pcVar12;
          this->n1 = (size_t)(pcVar14 + lVar22 + -(long)this);
          if (pcVar14 + -(long)this + -0x189 == pcVar17) {
            this->nbs = this->nbs + sVar20;
            goto LAB_00113df6;
          }
          this->b1 = this->buf + (long)(pcVar17 + 1);
          lVar22 = lVar22 + -1;
          pcVar12 = pcVar17 + 1;
        } while (this->buf[(long)(pcVar17 + 1)] == '\b');
        this->nbs = (size_t)(pcVar17 + 1 + this->nbs);
        this->bs = 0;
        pcVar12 = this->buf + (long)(pcVar17 + 1);
      }
      std::__cxx11::string::append((char *)&this->solve_msg_,(ulong)pcVar12);
      goto LAB_00113df6;
    }
  }
  else {
    pcVar21 = this->buf;
    do {
      sVar11 = fread(local_80,4,1,local_88);
      if (sVar11 == 0) goto LAB_0011478e;
      uVar15 = this->L;
      this->L1 = uVar15;
LAB_00113b22:
      if (uVar15 != 0) {
        sVar11 = 0x200;
        if (uVar15 < 0x200) {
          sVar11 = (size_t)uVar15;
        }
        this->n = sVar11;
        this->L = uVar15 - (int)sVar11;
        sVar11 = fread(pcVar21,sVar11,1,local_88);
        if (sVar11 == 0) goto LAB_0011478e;
        uVar15 = this->L;
        sVar20 = this->n;
        sVar19 = sVar20;
        if (uVar15 == 0) {
          do {
            sVar20 = sVar19;
            sVar19 = sVar20 - 1;
            if (sVar19 == 0xffffffffffffffff) {
              sVar20 = 0;
              goto LAB_00113ba1;
            }
            this->n = sVar19;
          } while (this->buf[sVar20 - 1] == ' ');
          this->n = sVar20;
        }
LAB_00113ba1:
        this->b1 = pcVar21;
        this->n1 = sVar20;
        pcVar14 = pcVar21;
        if ((this->buf[0] == '\b') && (this->bs != 0)) {
          lVar22 = -1;
          lVar5 = 0;
          do {
            lVar16 = lVar5;
            this->n1 = sVar20 + lVar22;
            if (sVar20 - 1 == lVar16) {
              this->nbs = this->nbs + sVar20;
              goto LAB_00113b22;
            }
            this->b1 = this->buf + lVar16 + 1;
            lVar22 = lVar22 + -1;
            lVar5 = lVar16 + 1;
          } while (this->buf[lVar16 + 1] == '\b');
          this->nbs = this->nbs + lVar16 + 1;
          this->bs = 0;
          pcVar14 = this->buf + lVar16 + 1;
        }
        std::__cxx11::string::append((char *)&this->solve_msg_,(ulong)pcVar14);
        uVar15 = *local_80;
        goto LAB_00113b22;
      }
      sVar11 = fread(local_80,4,1,local_88);
      if (sVar11 == 0) goto LAB_0011478e;
      if (this->L != this->L1) goto LAB_00113a6a;
    } while (this->L != 0);
    this->L1 = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons << 3;
    sVar11 = fread(local_80,4,1,local_88);
    if (sVar11 != 0) {
      uVar15 = this->L - 0x27;
      this->L2 = uVar15;
      if ((uVar15 & 3) == 0 && uVar15 < 0x19) {
        sVar11 = fread(pcVar21,7,1,local_88);
        if (sVar11 != 0) {
          iVar7 = bcmp(pcVar21,"Options",7);
          if (iVar7 != 0) goto LAB_00113a6a;
          sVar11 = fread(this->Options,4,4,local_88);
          if (sVar11 != 0) {
            iVar7 = this->Options[0];
            this->nOpts = iVar7;
            if (iVar7 - 10U < 0xfffffff9) goto LAB_00114648;
            if (this->Options[2] == 3) {
              iVar7 = iVar7 + -2;
              this->nOpts = iVar7;
              this->need_vbtol = 1;
            }
            sVar11 = fread(this->Options + 4,4,(ulong)(iVar7 + 1),local_88);
            if ((sVar11 != 0) &&
               ((this->need_vbtol == 0 || (sVar11 = fread(&this->vbtol,8,1,local_88), sVar11 != 0)))
               ) {
              sVar11 = fread(&this->L2,4,1,local_88);
              if ((sVar11 != 0) && (*local_80 == this->L2)) {
                this->have_options = 1;
                goto LAB_00114008;
              }
              goto LAB_00113a6a;
            }
          }
        }
        goto LAB_0011478e;
      }
      if (this->L == this->L1) goto LAB_00114008;
      goto LAB_00113a6a;
    }
  }
LAB_0011478e:
  NVar8 = ReportEarlyEof(this);
  goto LAB_00114798;
LAB_00113f0b:
  do {
    do {
      iVar7 = getc(pFVar10);
      this->j = iVar7;
    } while (iVar7 == 10);
  } while (iVar7 == 0xd);
  if (iVar7 == 0x4f) {
    pcVar14 = fgets(pcVar21,0x200,pFVar10);
    if (pcVar14 == (char *)0x0) goto LAB_0011478e;
    iVar7 = bcmp(pcVar21,"ptions",6);
    if (iVar7 != 0) goto LAB_00114008;
    this->have_options = 1;
    iVar7 = 0;
    while (this->j = iVar7, iVar7 < 4) {
      pcVar14 = fgets(pcVar21,0x200,local_88);
      if (pcVar14 == (char *)0x0) goto LAB_0011478e;
      lVar22 = strtol(pcVar21,__endptr,10);
      this->Options[this->j] = (Long)lVar22;
      if (this->se == pcVar21) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&ao,pcVar21,&local_89);
        NVar8 = ReportBadLine(this,(string *)&ao);
        goto LAB_0011467d;
      }
      iVar7 = this->j + 1;
    }
    iVar7 = this->Options[0];
    this->nOpts = iVar7;
    if (iVar7 - 10U < 0xfffffff9) {
LAB_00114648:
      serror(this,"expected nOpts between 3 and 9; got %d: ");
      goto LAB_00113a6a;
    }
    if (this->Options[2] == 3) {
      iVar7 = iVar7 + -2;
      this->nOpts = iVar7;
      this->need_vbtol = 1;
    }
    iVar7 = iVar7 + 5;
    this->je = iVar7;
    iVar9 = 4;
    while (this->j = iVar9, iVar9 < iVar7) {
      pcVar14 = fgets(pcVar21,0x200,local_88);
      if (pcVar14 == (char *)0x0) goto LAB_0011478e;
      lVar22 = strtol(pcVar21,__endptr,10);
      this->Options[this->j] = (Long)lVar22;
      if (this->se == pcVar21) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&ao,pcVar21,&local_89);
        NVar8 = ReportBadLine(this,(string *)&ao);
        goto LAB_0011467d;
      }
      iVar7 = this->je;
      iVar9 = this->j + 1;
    }
    if (this->need_vbtol == 0) goto LAB_00114008;
    pcVar14 = fgets(pcVar21,0x200,local_88);
    if (pcVar14 == (char *)0x0) goto LAB_0011478e;
    dVar24 = strtod(pcVar21,__endptr);
    this->vbtol = dVar24;
    if (this->se != pcVar21) goto LAB_00114008;
    std::__cxx11::string::string<std::allocator<char>>((string *)&ao,pcVar21,&local_89);
    NVar8 = ReportBadLine(this,(string *)&ao);
  }
  else {
    ungetc(iVar7,pFVar10);
LAB_00114008:
    if (this->nbs != 0) {
      pcVar1 = (this->solve_msg_)._M_dataplus._M_p;
      sVar2 = (this->solve_msg_)._M_string_length;
      for (sVar13 = 0; (sVar3 = sVar2, sVar2 != sVar13 && (sVar3 = sVar13, pcVar1[sVar13] == '\b'));
          sVar13 = sVar13 + 1) {
      }
      std::__cxx11::string::erase(&this->solve_msg_,pcVar1,pcVar1 + sVar3);
    }
    if ((this->solve_msg_)._M_string_length != 0) {
      if (this->binary != 0) {
        std::__cxx11::string::append((char *)&this->solve_msg_);
      }
      SOLHandler_Easy::OnSolveMessage
                (this->solh_,(this->solve_msg_)._M_dataplus._M_p,(int)this->nbs);
    }
    if (this->have_options == 0) {
      iVar7 = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      this->j = iVar7;
      pFVar10 = local_88;
    }
    else {
      this->z = this->Options + (long)this->nOpts + 1;
      this->internal_rv_ = 0x3e4;
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<long,std::allocator<long>>::_M_assign_aux<int*>
                ((vector<long,std::allocator<long>> *)&ao,this->Options,
                 this->Options + (long)this->nOpts + 5);
      pFVar10 = local_88;
      ao.has_vbtol_ = this->need_vbtol != 0;
      ao.vbtol_ = this->vbtol;
      iVar7 = this->z[3];
      this->j = iVar7;
      this->internal_rv_ = 0x3e5;
      if (iVar7 < 0 || (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars < iVar7) {
        pcVar21 = "Wrong NumVars %d, expected 0..%d: ";
LAB_00114169:
        serror(this,pcVar21);
LAB_00114173:
        NVar8 = ReportBadFormat(this);
LAB_0011417b:
        bVar6 = false;
      }
      else {
        iVar7 = this->z[1];
        this->j = iVar7;
        if (iVar7 < 0 ||
            (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons < iVar7) {
          pcVar21 = "Wrong NumAlgCons %d, expected 0..%d: ";
          goto LAB_00114169;
        }
        NVar8 = NLW2_SOLRead_Bad_Options;
        bVar6 = true;
        if (this->binary != 0) {
          this->L1 = iVar7 << 3;
          sVar11 = fread(local_80,4,1,local_88);
          if (sVar11 != 0) {
            if (this->L == this->L1) goto LAB_00114180;
            goto LAB_00114173;
          }
          NVar8 = ReportEarlyEof(this);
          goto LAB_0011417b;
        }
      }
LAB_00114180:
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&ao);
      if (!bVar6) goto LAB_00114798;
      iVar7 = this->j;
    }
    if (iVar7 != 0) {
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(iVar7,this->binary);
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
      ao._24_8_ = &local_50;
      ao.vbtol_ = 0.0;
      local_50._M_local_buf[0] = '\0';
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pFVar10;
      SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>(this->solh_,(VecReader<double> *)&ao);
      bVar6 = CheckReader<mp::VecReader<double>>(this,(VecReader<double> *)&ao,&this->readresult_);
      NVar8 = this->readresult_;
      std::__cxx11::string::~string((string *)&ao.has_vbtol_);
      if (!bVar6) goto LAB_00114798;
    }
    pNVar18 = &this->hdr_;
    if (this->have_options != 0) {
      pNVar18 = (NLHeader *)(this->z + 3);
    }
    uVar15 = (pNVar18->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
    this->nsv = uVar15;
    this->i = uVar15;
    this->sstatus_seen = 0;
    if (this->binary != 0) {
      sVar11 = fread(local_80,4,1,pFVar10);
      if ((sVar11 != 0) && (this->L == this->L1)) {
        this->L1 = this->i << 3;
        sVar11 = fread(local_80,4,1,local_88);
        pFVar10 = local_88;
        if ((sVar11 != 0) && (puVar23 = &this->L1, *local_80 == *puVar23)) {
          if (this->i != 0) {
            ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_88;
            ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)CONCAT44(this->i,this->binary);
            ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)ao.options_.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffff00000000);
            ao._24_8_ = &local_50;
            ao.vbtol_ = 0.0;
            local_50._M_local_buf[0] = '\0';
            SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                      (this->solh_,(VecReader<double> *)&ao);
            bVar6 = CheckReader<mp::VecReader<double>>
                              (this,(VecReader<double> *)&ao,&this->readresult_);
            NVar8 = this->readresult_;
            std::__cxx11::string::~string((string *)&ao.has_vbtol_);
            if (!bVar6) goto LAB_00114798;
          }
          sVar11 = fread(local_80,4,1,pFVar10);
          puVar4 = local_80;
          if ((sVar11 != 0) && (*local_80 == *puVar23)) {
            sVar11 = fread(local_80,4,1,local_88);
            if (sVar11 == 0) goto LAB_00114626;
            __size = (ulong)*puVar4;
            if ((__size == 8) || (*puVar4 == 4)) {
              this->ui = __size;
              sVar11 = fread(this->Objno,__size,1,local_88);
              if ((sVar11 == 1) &&
                 ((sVar11 = fread(puVar23,4,1,local_88), sVar11 == 1 &&
                  (uVar15 = *local_80, uVar15 == *puVar23)))) {
                this->objno = this->Objno[0];
                this->solh_->sol_->solve_result_ = this->Objno[1];
                pFVar10 = local_88;
                puVar23 = local_80;
                if ((uVar15 == 8) &&
                   (NVar8 = bsufread(this,(FILE *)local_88), pFVar10 = local_88, puVar23 = local_80,
                   NVar8 != NLW2_SOLRead_OK)) goto LAB_0011457d;
                do {
                  sVar11 = fread(puVar23,4,1,pFVar10);
                } while (sVar11 != 0);
                goto LAB_00114626;
              }
            }
          }
        }
      }
LAB_00113a6a:
      NVar8 = ReportBadFormat(this);
      goto LAB_00114798;
    }
    if (uVar15 != 0) {
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)uVar15 << 0x20);
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
      ao._24_8_ = &local_50;
      ao.vbtol_ = 0.0;
      local_50._M_local_buf[0] = '\0';
      ao.options_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pFVar10;
      SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>(this->solh_,(VecReader<double> *)&ao)
      ;
      bVar6 = CheckReader<mp::VecReader<double>>(this,(VecReader<double> *)&ao,&this->readresult_);
      NVar8 = this->readresult_;
      std::__cxx11::string::~string((string *)&ao.has_vbtol_);
      if (!bVar6) goto LAB_00114798;
    }
    pcVar21 = this->buf;
    pcVar14 = fgets(pcVar21,0x200,pFVar10);
    if (pcVar14 == (char *)0x0) {
LAB_00114626:
      this->internal_rv_ = 0;
      NVar8 = NLW2_SOLRead_OK;
      goto LAB_00114798;
    }
    iVar7 = bcmp(pcVar21,"objno ",6);
    if (iVar7 == 0) {
      this->s = this->buf + 6;
      dVar24 = strtod(this->buf + 6,&this->se);
      this->x = dVar24;
      pcVar14 = this->se;
      if (this->s < pcVar14) {
        this->objno = (int)dVar24;
        this->s = pcVar14;
        dVar24 = strtod(pcVar14,&this->se);
        this->x = dVar24;
        if (this->s < this->se) {
          this->Objno[1] = (int)dVar24;
          this->solh_->sol_->solve_result_ = (int)dVar24;
          NVar8 = gsufread(this,(FILE *)pFVar10);
          if (NVar8 != NLW2_SOLRead_OK) {
LAB_0011457d:
            if (NVar8 == NLW2_SOLRead_Bad_Suffix) {
              serror(this,"Bad suffix in \'%s\'\n",this->stub_);
              NVar8 = NLW2_SOLRead_Bad_Suffix;
            }
            else {
              NVar8 = this->readresult_;
            }
            goto LAB_00114798;
          }
        }
        goto LAB_00114626;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&ao,pcVar21,&local_89);
    NVar8 = ReportBadLine(this,(string *)&ao);
  }
LAB_0011467d:
  std::__cxx11::string::~string((string *)&ao);
LAB_00114798:
  File::~File(&local_38);
  return NVar8;
}

Assistant:

NLW2_SOLReadResultCode
SOLReader2<SOLHandler>::ReadSOLFile(
    const std::string& name) {
  File file;
  stub_ = name.c_str();

  file.Open(stub_, "rb");
  internal_rv_ = 997;
  if (!file) {
    serror("can't open '%s'", stub_);
    internal_rv_ = 998;
    return NLW2_SOLRead_Fail_Open;
  }
  FILE* f = file.GetHandle();
  if (fread((char *)&L, sizeof(uiolen), 1, f)
      && L == 6) {
    /* binary files may be written by Fortran unformatted writes */
    binary = 1;
    if (!fread(buf, 6, 1, f)
        || strncmp(buf,"binary",6)
        || !fread((char *)&L, sizeof(uiolen), 1, f)
        || L != 6) {
      return ReportBadFormat();
    }
  }
  else {
    binary = 0;
    rewind(f);
  }
  have_options = need_vbtol = 0;
  bs = 1;	/* omit initial backspaces */
  nbs = 0; /* number of backspaces omitted */
  if (binary) {     /////////////// BINARY FORMAT //////////
    for(;;) {       /////////////// SOLVE MESSAGE //////////
      if (!fread((char *)&L,sizeof(uiolen),1,f))
        return ReportEarlyEof();
      if ((L1 = L)) {
        do {
          n = L < sizeof(buf) ? (int)L : (int)sizeof(buf);
          L -= n;
          if (!fread(buf, n, 1, f))
            return ReportEarlyEof();
          if (!L) {
            while(n > 0) {
              if (buf[--n] != ' ') {
                ++n;
                break;
              }
            }
          }
          b1 = buf;
          n1 = n;
          if (buf[0] == '\b' && bs) {
            while(--n1 > 0
                  && *++b1 == '\b');
            nbs += n - n1;
            if (n1 > 0)
              bs = 0;
            else
              continue;
          }
          solve_msg_.append(b1, n1);
        }
        while(L);
      }
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
      if (!L)
        break;
    }
		L1 = NumAlgCons() * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f))
      return ReportEarlyEof();
    L2 = L - (8*sizeof(Long) + 7);
    if (L2 <= 4*sizeof(Long) + sizeof(real)
        && !(L2 & (sizeof(Long)-1))) {
      /////////////// check for Options ///////////////
      if (!fread(buf, 7, 1, f))
        return ReportEarlyEof();
      if (strncmp(buf, "Options", 7))
        return ReportBadFormat();
      if (!fread((char *)Options, sizeof(Long), 4, f))
        return ReportEarlyEof();
      nOpts = Options[0];
      if (nOpts < 3 || nOpts > 9) {
bad_nOpts:
        serror(
              "expected nOpts between 3 and 9; got %d: ",
              nOpts);
        return ReportBadFormat();
      }
      if (Options[2] == 3) {
        nOpts -= 2;
        need_vbtol = 1;
      }
      if (!fread((char *)(Options+4), sizeof(Long),
                 (size_t)(nOpts+1), f))
        return ReportEarlyEof();
      if (need_vbtol
          && !fread((char *)&vbtol, sizeof(real), 1, f))
        return ReportEarlyEof();
      if (!fread((char *)&L2, sizeof(uiolen), 1, f)
          || L != L2)
        return ReportBadFormat();
      have_options = 1;
    }
    else if (L != L1)
      return ReportBadFormat();
  }
  else {         ///////////////// TEXT FORMAT ///////////////
    for(;;) {    ///////////////// SOLVE MESSAGE /////////////
      if (!fgets(buf, sizeof(buf), f)) {
        return ReportEarlyEof();
      }
      for(se = buf; *se; se++)
        if (*se == '\r' && se[1] == '\n') {
          *se = '\n';
          *++se = 0;
          break;
        }
      if (*buf == '\n')
        break;
      n1 = se - buf;
      b1 = buf;
      if (buf[0] == '\b' && bs) {
        n = n1;
        while(--n1 > 0 && *++b1 == '\b');
        nbs += n - n1;
        if (n1 > 0)
          bs = 0;
        else
          continue;
      }
      solve_msg_.append(b1, n1);
    }
    while((j = getc(f)) == '\n' || j == '\r');
    if (j != 'O')     ////////// Check for Options //////////
      ungetc(j,f);
    else {
      if (!fgets(buf, sizeof(buf), f))
        return ReportEarlyEof();
      if (!strncmp(buf, "ptions", 6)) {
        have_options = 1;
        for(j = 0; j < 4; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        nOpts = Options[0];
        if (nOpts < 3 || nOpts > 9)
          goto bad_nOpts;
        if (Options[2] == 3) {
          nOpts -= 2;
          need_vbtol = 1;
        }
        je = (int)(nOpts+5);
        for(j = 4; j < je; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        if (need_vbtol) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          vbtol = strtod(buf,&se);
          if (se == buf)
            return ReportBadLine(buf);
        }
      }
    }
  }

  /* send termination msg */
  if (nbs) {
    // Should not have \b here but...
    auto b=solve_msg_.begin();
    while (solve_msg_.end()!=b && '\b'==*b)
      ++b;
    solve_msg_.erase(solve_msg_.begin(), b);
  }
  if (solve_msg_.size()) {
    if (binary)
      solve_msg_ += "\n";
    Handler().OnSolveMessage(
          solve_msg_.c_str(), nbs);
  }

  if (have_options) {
    z = Options + nOpts + 1;
    internal_rv_ = 996;
    // Send options to Handler:
    typename SOLHandler::AMPLOptions ao;
    ao.options_.assign(Options, Options+nOpts+5);
    ao.has_vbtol_ = need_vbtol;
    ao.vbtol_ = vbtol;
    // Handler says we should stop:
    if (auto rv = Handler().OnAMPLOptions(ao)) {
      internal_rv_ = rv;
      return NLW2_SOLRead_Bad_Options;
    }

    // Some checks.
    j = (int)z[3];
    internal_rv_ = 997;
		if (j > NumVars() || j < 0) {
      serror("Wrong NumVars %d, expected 0..%d: ",
						 j, NumVars());
      return ReportBadFormat();
      }
    j = (int)z[1];
		if (j > NumAlgCons() || j < 0) {
      serror("Wrong NumAlgCons %d, expected 0..%d: ",
						 j, NumAlgCons());
      return ReportBadFormat();
      }

    if (binary) {      // read on for binary
      L1 = j * sizeof(real);
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
    }
  }
	else j = NumAlgCons();

  // Read duals
  if (j) {
    VecReader<double> vr(f, binary, j);
    Handler().OnDualSolution(vr);
    if (!CheckReader( vr, readresult_ ))
      return readresult_;
  }

	i = nsv = have_options ? (int)z[3] : NumVars();
//  objno = ac_->no >= 0 ? 0 : -1;
  sstatus_seen = 0;
  if (binary) {
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();
    L1 = i * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    /* do we have an objno ? */
    if (fread((char *)&L, sizeof(uiolen), 1, f)) {
      if (L != 2*sizeof(Long) && L != sizeof(integer))
        return ReportBadFormat();
      ui = (size_t) L;
      if (fread(Objno, ui, 1, f) != 1
       || fread(&L1, sizeof(uiolen), 1, f) != 1
       || L != L1)
        return ReportBadFormat();
      objno = (int)Objno[0];

      /* Submit objno and solve_code to Handler. */
      Handler().OnObjno(objno);
      Handler().OnSolveCode(Objno[1]);

      if (L == 2*sizeof(integer)) {
        switch(bsufread(f)) {
        case NLW2_SOLRead_Bad_Suffix:
badsuftable:
          serror("Bad suffix in '%s'\n", stub_);
          return NLW2_SOLRead_Bad_Suffix;
        case NLW2_SOLRead_OK:
          break;
        default:
          return readresult_;
        }
      }
      while(fread(&L, sizeof(uiolen), 1, f)) {}
    }
  }
  else {
    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fgets(buf,sizeof(buf), f))
      goto f_done;
    if (strncmp(buf,"objno ",6)) {
bad_objno:
      return ReportBadLine(buf);
      }
    x = strtod(s = buf+6, &se);
    if (se <= s)
      goto bad_objno;
    objno = (int)x;
    x = strtod(s = se, &se);
    if (se <= s)
      goto f_done;
    Objno[1] = (Long)x;

    /* Submit objno and solve_code to Handler. */
    Handler().OnObjno(objno);
    Handler().OnSolveCode(Objno[1]);

    switch(gsufread(f)) {
    case NLW2_SOLRead_Bad_Suffix:
      goto badsuftable;
    case NLW2_SOLRead_OK:
      break;
    default:
      return readresult_;
    }
  }
f_done:
  internal_rv_ = 0;
  return NLW2_SOLRead_OK;
}